

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

ParserResult *
Catch::Clara::Detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  string srcLC;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  toLower(&local_88,source);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_88,"y");
  bVar4 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_88,"1");
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_88,"true");
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_88,"yes");
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_88,"on");
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_88,"n");
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_88,"0");
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_88,"false");
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_88,"no");
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_88,"off");
                    if (iVar1 != 0) {
                      std::operator+(&local_48,"Expected a boolean value but did not recognise: \'",
                                     source);
                      pbVar2 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_48,"\'");
                      local_68._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
                      paVar3 = &pbVar2->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_68._M_dataplus._M_p == paVar3) {
                        local_68.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
                        local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
                        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                      }
                      else {
                        local_68.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
                      }
                      local_68._M_string_length = pbVar2->_M_string_length;
                      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
                      pbVar2->_M_string_length = 0;
                      (pbVar2->field_2)._M_local_buf[0] = '\0';
                      BasicResult<Catch::Clara::ParseResultType>::BasicResult
                                (__return_storage_ptr__,RuntimeError,&local_68);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_68._M_dataplus._M_p != &local_68.field_2) {
                        operator_delete(local_68._M_dataplus._M_p,
                                        local_68.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_48._M_dataplus._M_p != &local_48.field_2) {
                        operator_delete(local_48._M_dataplus._M_p,
                                        local_48.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_0014a2e0;
                    }
                  }
                }
              }
            }
            bVar4 = false;
          }
        }
      }
    }
  }
  *target = bVar4;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001bc0c0;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0014a2e0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto(std::string const &source,
                bool &target) {
                std::string srcLC = toLower(source);

                if (srcLC == "y" || srcLC == "1" || srcLC == "true" ||
                    srcLC == "yes" || srcLC == "on") {
                    target = true;
                }
                else if (srcLC == "n" || srcLC == "0" || srcLC == "false" ||
                    srcLC == "no" || srcLC == "off") {
                    target = false;
                }
                else {
                    return ParserResult::runtimeError(
                        "Expected a boolean value but did not recognise: '" +
                        source + "'");
                }
                return ParserResult::ok(ParseResultType::Matched);
            }